

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

void __thiscall Heap<SAT::VarOrderLt>::percolateUp(Heap<SAT::VarOrderLt> *this,int i)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  vec<double> *pvVar4;
  int *piVar5;
  int *piVar6;
  double *pdVar7;
  uint uVar8;
  
  pvVar4 = (this->lt).activity;
  piVar5 = (this->heap).data;
  uVar2 = piVar5[(uint)i];
  piVar6 = (this->indices).data;
  while (i != 0) {
    uVar8 = (int)(i - 1U) >> 1;
    uVar3 = piVar5[uVar8];
    pdVar7 = pvVar4->data;
    dVar1 = pdVar7[uVar2];
    pdVar7 = pdVar7 + uVar3;
    if (dVar1 < *pdVar7 || dVar1 == *pdVar7) break;
    piVar5[(uint)i] = uVar3;
    piVar6[uVar3] = i;
    i = uVar8;
  }
  piVar5[(uint)i] = uVar2;
  piVar6[uVar2] = i;
  return;
}

Assistant:

inline void percolateUp(int i) {
		const int x = heap[i];
		while (i != 0 && lt(x, heap[parent(i)])) {
			heap[i] = heap[parent(i)];
			indices[heap[i]] = i;
			i = parent(i);
		}
		heap[i] = x;
		indices[x] = i;
	}